

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_manager.cpp
# Opt level: O0

void __thiscall cfd::CfdManager::Initialize(CfdManager *this)

{
  undefined8 uVar1;
  string *in_RDI;
  char *in_stack_ffffffffffffffa8;
  CfdError error_code;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  allocator local_29;
  string local_28 [40];
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (((in_RDI->field_2)._M_local_buf[1] & 1U) != 0) {
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Initialize already finalized.",&local_29);
    core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               error_code,in_RDI);
    __cxa_throw(uVar1,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (((in_RDI->field_2)._M_local_buf[0] & 1U) == 0) {
    core::Initialize((CfdCoreHandle *)&in_RDI->_M_string_length);
    (in_RDI->field_2)._M_local_buf[0] = '\x01';
    strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfd_manager.cpp"
            ,0x2f);
    core::logger::info<>((CfdSourceLocation *)&stack0xffffffffffffffa8,"cfd initialize.");
  }
  return;
}

Assistant:

void CfdManager::Initialize() {
  if (finalized_) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Initialize already finalized.");
  }

  if (!initialized_) {
    // 初期化処理実施
    cfd::core::Initialize(&handle_);
    initialized_ = true;
    info(CFD_LOG_SOURCE, "cfd initialize.");
  }
}